

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChVector<double>::GetOrthogonalVector
          (ChVector<double> *__return_storage_ptr__,ChVector<double> *this)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChVector<double> local_28;
  
  iVar2 = GetMaxComponent(this);
  lVar1 = (long)(iVar2 + 1) % 3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_data[(int)lVar1];
  local_28.m_data[1] = this->m_data[iVar2];
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar4,auVar3);
  local_28.m_data[2] = this->m_data[(int)((char)((char)lVar1 + '\x01') % '\x03')];
  local_28.m_data[0] = (double)vmovlpd_avx(auVar3);
  Cross(__return_storage_ptr__,this,&local_28);
  Normalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChVector<Real>::GetOrthogonalVector() const {
    int idx1 = this->GetMaxComponent();
    int idx2 = (idx1 + 1) % 3;  // cycle to the next component
    int idx3 = (idx2 + 1) % 3;  // cycle to the next component

    // Construct v2 by rotating in the plane containing the maximum component
    ChVector<Real> v2(-m_data[idx2], m_data[idx1], m_data[idx3]);

    // Construct the normal vector
    ChVector<Real> ortho = Cross(v2);
    ortho.Normalize();
    return ortho;
}